

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LDLt(TPZMatrix<Fad<double>_> *this)

{
  byte bVar1;
  value_type vVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  int i;
  ulong uVar8;
  double *pdVar9;
  double dVar10;
  ulong uVar11;
  int sz;
  Fad<double> tmp;
  Fad<double> val;
  Fad<double> sum_1;
  Fad<double> sum;
  Fad<double> local_148;
  Fad<double> local_128;
  Fad<double> local_108;
  double local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  Fad<double> local_a0;
  Fad<double> local_80;
  undefined1 local_60 [32];
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_40;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
  }
  uVar4 = (uint)(this->super_TPZBaseMatrix).fRow;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    local_d8 = 1;
    dVar10 = (double)0;
    do {
      local_a0.val_ = 0.0;
      local_a0.dx_.num_elts = 0;
      local_a0.dx_.ptr_to_data = (double *)0x0;
      local_a0.defaultVal = 0.0;
      if (dVar10 != 0.0) {
        uVar11 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_148,this,uVar11,uVar11);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_108,this,uVar11,dVar10);
          local_60._0_8_ = &local_148;
          local_60._8_8_ = &local_108;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_128,this,uVar11,dVar10);
          local_c0._0_8_ = (Fad<double> *)local_60;
          local_c0._8_8_ = &local_128;
          Fad<double>::operator+=
                    (&local_a0,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                      *)local_c0);
          Fad<double>::~Fad(&local_128);
          Fad<double>::~Fad(&local_108);
          Fad<double>::~Fad(&local_148);
          uVar11 = uVar11 + 1;
        } while (dVar10 != (double)uVar11);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_108,this,dVar10)
      ;
      iVar3 = local_a0.dx_.num_elts;
      local_148.val_ = local_108.val_ - local_a0.val_;
      uVar4 = local_a0.dx_.num_elts;
      if (local_a0.dx_.num_elts < local_108.dx_.num_elts) {
        uVar4 = local_108.dx_.num_elts;
      }
      local_148.dx_.num_elts = 0;
      local_148.dx_.ptr_to_data = (double *)0x0;
      if (0 < (int)uVar4) {
        local_e8 = (double)CONCAT44(local_e8._4_4_,local_108.dx_.num_elts);
        uVar11 = (ulong)uVar4;
        local_148.dx_.num_elts = uVar4;
        local_148.dx_.ptr_to_data = (double *)operator_new__(uVar11 * 8);
        if (0 < (int)uVar4) {
          lVar6 = 0;
          do {
            pdVar7 = (double *)((long)local_108.dx_.ptr_to_data + lVar6);
            if (local_e8._0_4_ == 0) {
              pdVar7 = &local_108.defaultVal;
            }
            pdVar9 = (double *)((long)local_a0.dx_.ptr_to_data + lVar6);
            if (iVar3 == 0) {
              pdVar9 = &local_a0.defaultVal;
            }
            *(double *)((long)local_148.dx_.ptr_to_data + lVar6) = *pdVar7 - *pdVar9;
            lVar6 = lVar6 + 8;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
      }
      local_148.defaultVal = 0.0;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,dVar10,dVar10,&local_148);
      Fad<double>::~Fad(&local_148);
      Fad<double>::~Fad(&local_108);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_148,this,dVar10,dVar10);
      iVar3 = local_148.dx_.num_elts;
      local_80.val_ = local_148.val_;
      local_80.dx_.num_elts = local_148.dx_.num_elts;
      local_80.dx_.ptr_to_data = (double *)0x0;
      if ((long)local_148.dx_.num_elts != 0) {
        uVar11 = (long)local_148.dx_.num_elts * 8;
        if (local_148.dx_.num_elts < 0) {
          uVar11 = 0xffffffffffffffff;
        }
        local_80.dx_.ptr_to_data = (double *)operator_new__(uVar11);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_80.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)local_148.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar3);
      }
      local_80.defaultVal = local_148.defaultVal;
      local_e8 = ABS(local_80.val_);
      uStack_e0 = 0;
      Fad<double>::~Fad(&local_80);
      if (local_e8 < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_e8 = (double)((long)dVar10 + 1);
      uVar11 = local_d8;
      if ((ulong)local_e8 < uVar5) {
        do {
          local_108.val_ = 0.0;
          local_108.dx_.num_elts = 0;
          local_108.dx_.ptr_to_data = (double *)0x0;
          local_108.defaultVal = 0.0;
          if (dVar10 != 0.0) {
            uVar8 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_128,this,uVar8,uVar8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<double> *)local_c0,this,dVar10,uVar8);
              local_40.fadexpr_.left_ = &local_128;
              local_40.fadexpr_.right_ = (Fad<double> *)local_c0;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<double> *)local_60,this,uVar11,uVar8);
              local_d0._0_8_ = &local_40;
              local_d0._8_8_ = (Fad<double> *)local_60;
              Fad<double>::operator+=
                        (&local_108,
                         (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                          *)local_d0);
              Fad<double>::~Fad((Fad<double> *)local_60);
              Fad<double>::~Fad((Fad<double> *)local_c0);
              Fad<double>::~Fad(&local_128);
              uVar8 = uVar8 + 1;
            } while (dVar10 != (double)uVar8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_c0,this,uVar11,
                     dVar10);
          local_d0._8_8_ = &local_108;
          local_60._0_8_ = local_d0;
          local_60._8_8_ = &local_148;
          local_128.val_ = ((double)local_c0._0_8_ - local_108.val_) / local_148.val_;
          uVar4 = local_108.dx_.num_elts;
          if (local_108.dx_.num_elts < (int)local_c0._8_4_) {
            uVar4 = local_c0._8_4_;
          }
          if ((int)uVar4 <= local_148.dx_.num_elts) {
            uVar4 = local_148.dx_.num_elts;
          }
          local_128.dx_.num_elts = 0;
          local_128.dx_.ptr_to_data = (double *)0x0;
          local_d0._0_8_ = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_c0;
          if ((int)uVar4 < 1) {
            local_128.defaultVal = 0.0;
          }
          else {
            local_128.dx_.num_elts = uVar4;
            local_128.dx_.ptr_to_data = (double *)operator_new__((ulong)uVar4 * 8);
            local_128.defaultVal = 0.0;
            if (0 < (int)uVar4) {
              uVar8 = 0;
              do {
                vVar2 = FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                        ::dx((FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                              *)local_60,(int)uVar8);
                local_128.dx_.ptr_to_data[uVar8] = vVar2;
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
          }
          Fad<double>::~Fad((Fad<double> *)local_c0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar11,dVar10,&local_128);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,dVar10,uVar11,&local_128);
          Fad<double>::~Fad(&local_128);
          Fad<double>::~Fad(&local_108);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar5);
      }
      Fad<double>::~Fad(&local_148);
      Fad<double>::~Fad(&local_a0);
      local_d8 = local_d8 + 1;
      dVar10 = local_e8;
    } while (local_e8 != (double)uVar5);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}